

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

string * qclab::io::left_of(string *__return_storage_ptr__,string *str,string *delimiter)

{
  string local_60 [35];
  undefined1 local_3d;
  allocator<char> local_29;
  long local_28;
  size_type pos;
  string *delimiter_local;
  string *str_local;
  string *left_of;
  
  pos = (size_type)delimiter;
  delimiter_local = str;
  str_local = __return_storage_ptr__;
  local_28 = std::__cxx11::string::find_first_of((string *)str,(ulong)delimiter);
  if (local_28 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else if (local_28 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)delimiter_local);
  }
  else {
    local_3d = 0;
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)delimiter_local);
    std::__cxx11::string::substr((ulong)local_60,(ulong)delimiter_local);
    std::__cxx11::string::operator=((string *)delimiter_local,local_60);
    std::__cxx11::string::~string(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string left_of( std::string& str , const std::string delimiter ) {
    auto pos = str.find_first_of( delimiter ) ;
    if ( pos == 0 ) {
      return "" ;
    } else if ( pos == std::string::npos ) {
      return str ;
    }
    std::string left_of = str.substr( 0 , pos ) ;
    str = str.substr( pos + 1 ) ;
    return left_of ;
  }